

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

char * feat_prompt(wchar_t oid)

{
  if ((ulong)f_uik_lighting < 3) {
    return &DAT_0025f5cc + *(int *)(&DAT_0025f5cc + (ulong)f_uik_lighting * 4);
  }
  return ", \'t/T\' for lighting (dark)";
}

Assistant:

static const char *feat_prompt(int oid)
{
	(void)oid;
		switch (f_uik_lighting) {
				case LIGHTING_LIT:  return ", 't/T' for lighting (lit)";
                case LIGHTING_TORCH: return ", 't/T' for lighting (torch)";
				case LIGHTING_LOS:  return ", 't/T' for lighting (LOS)";
				default:	return ", 't/T' for lighting (dark)";
		}		
}